

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferInUseRenderTimeCase::init
          (BufferInUseRenderTimeCase *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  UploadBufferTarget UVar2;
  MapFlags MVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  int numBytes;
  int numBytes_00;
  char *pcVar7;
  long lVar8;
  char *__s;
  MessageBuilder message;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::init
            (&this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ,ctx);
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ).m_drawMethod;
  pcVar6 = "Draw method: drawElements";
  if (DVar1 == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar6 = "Draw method: drawArrays";
  }
  pcVar7 = "mapBufferRange";
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
    pcVar7 = "bufferSubData";
  }
  __s = "bufferData";
  if (this->m_uploadMethod != UPLOADMETHOD_BUFFER_DATA) {
    __s = pcVar7;
  }
  UVar2 = this->m_uploadBufferTarget;
  local_1b0 = (undefined1  [8])
              ((this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
               ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Measuring the time used in ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar6 + 0xd,(ulong)(DVar1 != DRAWMETHOD_DRAW_ARRAYS) * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," call, a buffer upload, ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar6 + 0xd,(ulong)(DVar1 != DRAWMETHOD_DRAW_ARRAYS) * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             " call using the uploaded buffer and readPixels call with different upload sizes.\n",
             0x51);
  iVar4 = (int)(ostringstream *)&local_1a8;
  if (UVar2 == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Rendering:\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    before test: create and use buffers B and C\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    first draw: render using buffer B\n",0x26);
    pcVar6 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar6 = "    upload: modify buffer C contents\n";
    }
    pcVar7 = "    upload: respecify buffer C contents\n";
    if (this->m_uploadRange != UPLOADRANGE_FULL) {
      pcVar7 = pcVar6;
    }
    if (pcVar7 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)local_1a8[-3]);
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    second draw: render using buffer C\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    read: readPixels\n",0x15);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Rendering:\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    before test: create and use buffer B\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    first draw: render using buffer B\n",0x26);
    pcVar6 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar6 = "    upload: modify buffer B contents\n";
    }
    pcVar7 = "    upload: respecify buffer B contents\n";
    if (this->m_uploadRange != UPLOADRANGE_FULL) {
      pcVar7 = pcVar6;
    }
    if (pcVar7 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)local_1a8[-3]);
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    second draw: render using buffer B\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"    read: readPixels\n",0x15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Uploading using ",0x10);
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar5);
  MVar3 = this->m_mapFlags;
  if (MVar3 == MAPFLAG_INVALIDATE_BUFFER) {
    pcVar6 = ", flags = MAP_WRITE_BIT | MAP_INVALIDATE_BUFFER_BIT";
  }
  else if (MVar3 == MAPFLAG_INVALIDATE_RANGE) {
    pcVar6 = ", flags = MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT";
  }
  else {
    pcVar6 = (bool *)0x0;
    if (MVar3 == MAPFLAG_NONE) {
      pcVar6 = glcts::fixed_sample_locations_values + 1;
    }
  }
  if ((bool *)pcVar6 == (bool *)0x0) {
    std::ios::clear(iVar4 + (int)local_1a8[-3]);
  }
  else {
    sVar5 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::ostream::operator<<
            ((ostringstream *)&local_1a8,
             (int)((ulong)((long)(this->
                                 super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                                 ).m_results.
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                                ).m_results.
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," test samples. Sample order is randomized.\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Workload sizes are in the range [",0x21);
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  std::ostream::operator<<((ostringstream *)&local_1a8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",  ",3);
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  std::ostream::operator<<((ostringstream *)&local_1a8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] vertices ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"([",2);
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)(ulong)(uint)(iVar4 << 5),numBytes);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",",1);
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)(uint)(iVar4 << 5),numBytes_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"] to be processed).\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "Test result is the approximated processing rate in MiB / s of the second draw call and the readPixels call.\n"
             ,0x6c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = 
  "Note! Test result may not be useful as is but instead should be compared against the buffer.render_after_upload.reference.draw_upload_draw group results.\n"
  ;
  if (UVar2 == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    pcVar6 = 
    "Note! Test result should only be used as a baseline reference result for buffer.render_after_upload.draw_modify_draw test group results."
    ;
  }
  lVar8 = 0x9a;
  if (UVar2 == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    lVar8 = 0x88;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,lVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  iVar4 = std::ios_base::~ios_base(local_138);
  return iVar4;
}

Assistant:

void BufferInUseRenderTimeCase::init (void)
{
	RenderCase<RenderUploadRenderReadDuration>::init();

	// log
	{
		const char* const	targetFunctionName		= (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");
		const char* const	uploadFunctionName		= (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) ? ("bufferData") : (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) ? ("bufferSubData") : ("mapBufferRange");
		const bool			isReferenceCase			= (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER);
		tcu::MessageBuilder	message					(&m_testCtx.getLog());

		message	<< "Measuring the time used in " << targetFunctionName << " call, a buffer upload, "
				<< targetFunctionName << " call using the uploaded buffer and readPixels call with different upload sizes.\n";

		if (isReferenceCase)
			message << "Rendering:\n"
					<< "    before test: create and use buffers B and C\n"
					<< "    first draw: render using buffer B\n"
					<< ((m_uploadRange == UPLOADRANGE_FULL)		? ("    upload: respecify buffer C contents\n")	:
						(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("    upload: modify buffer C contents\n")	:
						((const char*)DE_NULL))
					<< "    second draw: render using buffer C\n"
					<< "    read: readPixels\n";
		else
			message << "Rendering:\n"
					<< "    before test: create and use buffer B\n"
					<< "    first draw: render using buffer B\n"
					<< ((m_uploadRange == UPLOADRANGE_FULL)		? ("    upload: respecify buffer B contents\n")	:
						(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("    upload: modify buffer B contents\n")	:
						((const char*)DE_NULL))
					<< "    second draw: render using buffer B\n"
					<< "    read: readPixels\n";

		message	<< "Uploading using " << uploadFunctionName
					<< ((m_mapFlags == MAPFLAG_INVALIDATE_RANGE)	? (", flags = MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT")	:
						(m_mapFlags == MAPFLAG_INVALIDATE_BUFFER)	? (", flags = MAP_WRITE_BIT | MAP_INVALIDATE_BUFFER_BIT")	:
						(m_mapFlags == MAPFLAG_NONE)				? ("")														:
						((const char*)DE_NULL))
					<< "\n"
				<< getNumSamples() << " test samples. Sample order is randomized.\n"
				<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
				<< "Workload sizes are in the range ["
					<< getMinWorkloadSize() << ",  "
					<< getMaxWorkloadSize() << "] vertices "
					<< "(["
					<< getHumanReadableByteSize(getMinWorkloadDataSize()) << ","
					<< getHumanReadableByteSize(getMaxWorkloadDataSize()) << "] to be processed).\n"
				<< "Test result is the approximated processing rate in MiB / s of the second draw call and the readPixels call.\n";

		if (isReferenceCase)
			message	<< "Note! Test result should only be used as a baseline reference result for buffer.render_after_upload.draw_modify_draw test group results.";
		else
			message	<< "Note! Test result may not be useful as is but instead should be compared against the buffer.render_after_upload.reference.draw_upload_draw group results.\n";

		message << tcu::TestLog::EndMessage;
	}
}